

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpParser.cpp
# Opt level: O1

string * __thiscall
TgBot::HttpParser::generateMultipartBoundary_abi_cxx11_
          (string *__return_storage_ptr__,HttpParser *this,
          vector<TgBot::HttpReqArg,_std::allocator<TgBot::HttpReqArg>_> *args)

{
  pointer pHVar1;
  time_t tVar2;
  size_t extraout_RDX;
  size_t length;
  size_t extraout_RDX_00;
  size_t extraout_RDX_01;
  pointer pHVar3;
  undefined1 auVar4 [16];
  string local_50;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  tVar2 = time((time_t *)0x0);
  srand((uint)tVar2);
  pHVar3 = (args->super__Vector_base<TgBot::HttpReqArg,_std::allocator<TgBot::HttpReqArg>_>)._M_impl
           .super__Vector_impl_data._M_start;
  pHVar1 = (args->super__Vector_base<TgBot::HttpReqArg,_std::allocator<TgBot::HttpReqArg>_>)._M_impl
           .super__Vector_impl_data._M_finish;
  if (pHVar3 != pHVar1) {
    length = extraout_RDX;
    do {
      if (pHVar3->isFile == true) {
LAB_001e67f6:
        if (__return_storage_ptr__->_M_string_length != 0) {
          auVar4 = std::__cxx11::string::find
                             ((char *)&pHVar3->value,
                              (ulong)(__return_storage_ptr__->_M_dataplus)._M_p,0);
          length = auVar4._8_8_;
          if (auVar4._0_8_ == -1) goto LAB_001e6842;
        }
        StringTools::generateRandomString_abi_cxx11_(&local_50,(StringTools *)0x4,length);
        std::__cxx11::string::_M_append
                  ((char *)__return_storage_ptr__,(ulong)local_50._M_dataplus._M_p);
        length = extraout_RDX_00;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p);
          length = extraout_RDX_01;
        }
        goto LAB_001e67f6;
      }
LAB_001e6842:
      pHVar3 = pHVar3 + 1;
    } while (pHVar3 != pHVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

string HttpParser::generateMultipartBoundary(const vector<HttpReqArg>& args) const {
    string result;
    srand((uint32_t) time(nullptr));
    for (const HttpReqArg& item : args) {
        if (item.isFile) {
            while (result.empty() || item.value.find(result) != string::npos) {
                result += StringTools::generateRandomString(4);
            }
        }
    }
    return result;
}